

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

double __thiscall llvm::frexp(llvm *this,double __x,int *__exponent)

{
  int *__exponent_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  DoubleAPFloat local_40;
  IEEEFloat local_30;
  
  __exponent_00 = __exponent + 2;
  if (*(undefined1 **)(__exponent + 2) == semPPCDoubleDouble) {
    detail::frexp((detail *)&local_40,__x,__exponent_00);
    APFloat::APFloat((APFloat *)this,&local_40,*(fltSemantics **)__exponent_00);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&local_40.Floats);
    dVar1 = extraout_XMM0_Qa_00;
  }
  else {
    detail::frexp(__x,(int *)&local_30);
    APFloat::APFloat((APFloat *)this,&local_30,*(fltSemantics **)__exponent_00);
    detail::IEEEFloat::~IEEEFloat(&local_30);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

inline APFloat frexp(const APFloat &X, int &Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}